

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMiniSDF.cpp
# Opt level: O1

bool __thiscall cbtMiniSDF::load(cbtMiniSDF *this,char *data,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  cbtAlignedObjectArray<cbtCell32> *pcVar6;
  cbtAlignedObjectArray<unsigned_int> *pcVar7;
  uint *puVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  double *pdVar25;
  cbtCell32 *pcVar26;
  uint *puVar27;
  undefined4 in_register_00000014;
  long lVar28;
  cbtAlignedObjectArray<double> *pcVar29;
  long lVar30;
  char *pcVar31;
  uint uVar32;
  cbtMiniSDF *pcVar33;
  int iVar34;
  undefined8 in_R8;
  ulong uVar35;
  long in_R9;
  ulong unaff_R12;
  uint uVar36;
  cbtAlignedObjectArray<double> *unaff_R15;
  unsigned_long_long n_cell_maps1;
  undefined1 uVar37;
  cbtScalar in_XMM0_Da;
  cbtScalar in_XMM1_Da;
  cbtScalar in_XMM2_Da;
  cbtScalar in_XMM3_Da;
  cbtScalar in_XMM4_Da;
  cbtScalar in_XMM5_Da;
  cbtAlignedObjectArray<cbtCell32> local_50;
  
  uVar35 = CONCAT44(in_register_00000014,size);
  uVar36 = 0;
  if (0x2f < size) {
    in_XMM4_Da = (cbtScalar)*(double *)data;
    in_XMM3_Da = (cbtScalar)*(double *)(data + 8);
    in_XMM2_Da = (cbtScalar)*(double *)(data + 0x10);
    in_XMM1_Da = (cbtScalar)*(double *)(data + 0x18);
    in_XMM0_Da = (cbtScalar)*(double *)(data + 0x20);
    in_XMM5_Da = (cbtScalar)*(double *)(data + 0x28);
    uVar36 = 0x30;
  }
  (this->m_domain).m_min.m_floats[0] = in_XMM4_Da;
  (this->m_domain).m_min.m_floats[1] = in_XMM3_Da;
  (this->m_domain).m_min.m_floats[2] = in_XMM2_Da;
  (this->m_domain).m_min.m_floats[3] = 0.0;
  (this->m_domain).m_max.m_floats[0] = in_XMM1_Da;
  (this->m_domain).m_max.m_floats[1] = in_XMM0_Da;
  (this->m_domain).m_max.m_floats[2] = in_XMM5_Da;
  (this->m_domain).m_max.m_floats[3] = 0.0;
  pcVar31 = data;
  pcVar33 = this;
  if ((int)(uVar36 | 0xc) <= size) {
    uVar35 = (ulong)*(uint *)(data + (ulong)uVar36 + 8);
    pcVar31 = (char *)(ulong)*(uint *)(data + (ulong)uVar36 + 4);
    pcVar33 = (cbtMiniSDF *)(ulong)*(uint *)(data + uVar36);
    uVar36 = uVar36 | 0xc;
  }
  this->m_resolution[0] = (uint)pcVar33;
  this->m_resolution[1] = (uint)pcVar31;
  this->m_resolution[2] = (uint)uVar35;
  if ((int)(uVar36 + 0x18) <= size) {
    in_XMM2_Da = (cbtScalar)*(double *)(data + uVar36);
    in_XMM1_Da = (cbtScalar)*(double *)(data + (ulong)uVar36 + 8);
    in_XMM0_Da = (cbtScalar)*(double *)(data + (ulong)uVar36 + 0x10);
    uVar36 = uVar36 + 0x18;
  }
  (this->m_cell_size).m_floats[0] = in_XMM2_Da;
  (this->m_cell_size).m_floats[1] = in_XMM1_Da;
  (this->m_cell_size).m_floats[2] = in_XMM0_Da;
  if ((int)(uVar36 + 0x18) <= size) {
    in_XMM2_Da = (cbtScalar)*(double *)(data + uVar36);
    in_XMM1_Da = (cbtScalar)*(double *)(data + (ulong)uVar36 + 8);
    in_XMM0_Da = (cbtScalar)*(double *)(data + (ulong)uVar36 + 0x10);
    uVar36 = uVar36 + 0x18;
  }
  (this->m_inv_cell_size).m_floats[0] = in_XMM2_Da;
  (this->m_inv_cell_size).m_floats[1] = in_XMM1_Da;
  (this->m_inv_cell_size).m_floats[2] = in_XMM0_Da;
  if ((int)(uVar36 + 8) <= size) {
    uVar35 = *(ulong *)(data + uVar36);
    uVar36 = uVar36 + 8;
  }
  uVar24 = (ulong)uVar36;
  this->m_n_cells = uVar35;
  if ((int)(uVar36 + 8) <= size) {
    uVar35 = *(ulong *)(data + uVar24);
    uVar24 = (ulong)(uVar36 + 8);
  }
  this->m_n_fields = uVar35;
  uVar36 = (uint)uVar24;
  if ((int)(uVar36 + 8) <= size) {
    unaff_R12 = *(ulong *)(data + uVar24);
    uVar36 = uVar36 + 8;
  }
  if (unaff_R12 < 0x40000001) {
    local_50.m_ownsMemory = true;
    local_50.m_data = (cbtCell32 *)0x0;
    local_50.m_size = 0;
    local_50.m_capacity = 0;
    cbtAlignedObjectArray<cbtAlignedObjectArray<double>_>::resize
              (&this->m_nodes,(uint)unaff_R12,(cbtAlignedObjectArray<double> *)&local_50);
    cbtAlignedObjectArray<double>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<double> *)&local_50);
    if (unaff_R12 != 0) {
      uVar32 = 0;
      do {
        if ((int)(uVar36 + 8) <= size) {
          in_R8 = *(undefined8 *)(data + (int)uVar36);
          uVar36 = uVar36 + 8;
        }
        pcVar29 = (this->m_nodes).m_data;
        unaff_R15 = pcVar29 + (int)uVar32;
        iVar3 = pcVar29[(int)uVar32].m_size;
        iVar34 = (int)in_R8;
        if ((iVar3 <= iVar34) && (iVar3 < iVar34)) {
          if (unaff_R15->m_capacity < iVar34) {
            if (iVar34 == 0) {
              pdVar25 = (double *)0x0;
            }
            else {
              pdVar25 = (double *)cbtAlignedAllocInternal((long)iVar34 << 3,0x10);
            }
            iVar4 = unaff_R15->m_size;
            if (0 < (long)iVar4) {
              pdVar5 = unaff_R15->m_data;
              lVar28 = 0;
              do {
                pdVar25[lVar28] = pdVar5[lVar28];
                lVar28 = lVar28 + 1;
              } while (iVar4 != lVar28);
            }
            if (unaff_R15->m_data != (double *)0x0) {
              if (unaff_R15->m_ownsMemory == true) {
                cbtAlignedFreeInternal(unaff_R15->m_data);
              }
              unaff_R15->m_data = (double *)0x0;
            }
            unaff_R15->m_ownsMemory = true;
            unaff_R15->m_data = pdVar25;
            unaff_R15->m_capacity = iVar34;
          }
          if (iVar3 < iVar34) {
            memset(unaff_R15->m_data + iVar3,0,(long)iVar34 * 8 + (long)iVar3 * -8);
          }
        }
        unaff_R15->m_size = iVar34;
        if (0 < iVar34) {
          lVar28 = 0;
          do {
            if ((int)(uVar36 + 8) <= size) {
              unaff_R15->m_data[lVar28] = *(double *)(data + (int)uVar36);
              uVar36 = uVar36 + 8;
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 < unaff_R15->m_size);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 < (uint)unaff_R12);
    }
    if ((int)(uVar36 + 8) <= size) {
      unaff_R12 = *(ulong *)(data + (int)uVar36);
      uVar36 = uVar36 + 8;
    }
    pcVar29 = (cbtAlignedObjectArray<double> *)(ulong)uVar36;
    local_50.m_ownsMemory = true;
    local_50.m_data = (cbtCell32 *)0x0;
    local_50.m_size = 0;
    local_50.m_capacity = 0;
    cbtAlignedObjectArray<cbtAlignedObjectArray<cbtCell32>_>::resize
              (&this->m_cells,(int)unaff_R12,&local_50);
    cbtAlignedObjectArray<cbtCell32>::~cbtAlignedObjectArray(&local_50);
    if (unaff_R12 != 0) {
      uVar35 = 0;
      do {
        uVar36 = (int)pcVar29 + 8;
        if ((int)uVar36 <= size) {
          in_R9 = *(long *)(data + (int)pcVar29);
          pcVar29 = (cbtAlignedObjectArray<double> *)(ulong)uVar36;
        }
        pcVar6 = (this->m_cells).m_data;
        iVar3 = pcVar6[uVar35].m_size;
        iVar34 = (int)in_R9;
        if ((iVar3 <= iVar34) && (iVar3 < iVar34)) {
          if (pcVar6[uVar35].m_capacity < iVar34) {
            if (iVar34 == 0) {
              pcVar26 = (cbtCell32 *)0x0;
            }
            else {
              pcVar26 = (cbtCell32 *)cbtAlignedAllocInternal((long)iVar34 << 7,0x10);
            }
            iVar4 = pcVar6[uVar35].m_size;
            if (0 < (long)iVar4) {
              lVar28 = 0;
              do {
                puVar1 = (undefined8 *)((long)(pcVar6[uVar35].m_data)->m_cells + lVar28);
                uVar9 = *puVar1;
                uVar10 = puVar1[1];
                uVar11 = puVar1[2];
                uVar12 = puVar1[3];
                uVar13 = puVar1[4];
                uVar14 = puVar1[5];
                uVar15 = puVar1[6];
                uVar16 = puVar1[7];
                puVar1 = (undefined8 *)((long)(pcVar6[uVar35].m_data)->m_cells + lVar28 + 0x40);
                uVar17 = puVar1[1];
                uVar18 = puVar1[2];
                uVar19 = puVar1[3];
                uVar20 = puVar1[4];
                uVar21 = puVar1[5];
                uVar22 = puVar1[6];
                uVar23 = puVar1[7];
                puVar2 = (undefined8 *)((long)pcVar26->m_cells + lVar28 + 0x40);
                *puVar2 = *puVar1;
                puVar2[1] = uVar17;
                puVar2[2] = uVar18;
                puVar2[3] = uVar19;
                puVar2[4] = uVar20;
                puVar2[5] = uVar21;
                puVar2[6] = uVar22;
                puVar2[7] = uVar23;
                puVar1 = (undefined8 *)((long)pcVar26->m_cells + lVar28);
                *puVar1 = uVar9;
                puVar1[1] = uVar10;
                puVar1[2] = uVar11;
                puVar1[3] = uVar12;
                puVar1[4] = uVar13;
                puVar1[5] = uVar14;
                puVar1[6] = uVar15;
                puVar1[7] = uVar16;
                lVar28 = lVar28 + 0x80;
              } while ((long)iVar4 * 0x80 != lVar28);
            }
            if (pcVar6[uVar35].m_data != (cbtCell32 *)0x0) {
              if (pcVar6[uVar35].m_ownsMemory == true) {
                cbtAlignedFreeInternal(pcVar6[uVar35].m_data);
              }
              pcVar6[uVar35].m_data = (cbtCell32 *)0x0;
            }
            pcVar6[uVar35].m_ownsMemory = true;
            pcVar6[uVar35].m_data = pcVar26;
            pcVar6[uVar35].m_capacity = iVar34;
          }
          if (iVar3 < iVar34) {
            lVar28 = (long)iVar34 - (long)iVar3;
            lVar30 = (long)iVar3 << 7;
            do {
              pcVar26 = pcVar6[uVar35].m_data;
              puVar1 = (undefined8 *)((long)pcVar26->m_cells + lVar30 + 0x40);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1[2] = 0;
              puVar1[3] = 0;
              puVar1[4] = 0;
              puVar1[5] = 0;
              puVar1[6] = 0;
              puVar1[7] = 0;
              puVar1 = (undefined8 *)((long)pcVar26->m_cells + lVar30);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1[2] = 0;
              puVar1[3] = 0;
              puVar1[4] = 0;
              puVar1[5] = 0;
              puVar1[6] = 0;
              puVar1[7] = 0;
              lVar30 = lVar30 + 0x80;
              lVar28 = lVar28 + -1;
            } while (lVar28 != 0);
          }
        }
        pcVar6[uVar35].m_size = iVar34;
        if (in_R9 != 0) {
          lVar30 = 0;
          lVar28 = in_R9;
          do {
            iVar3 = (int)pcVar29;
            if ((int)(iVar3 + 0x80U) <= size) {
              pcVar26 = pcVar6[uVar35].m_data;
              pcVar31 = data + iVar3;
              uVar9 = *(undefined8 *)pcVar31;
              uVar10 = *(undefined8 *)(pcVar31 + 8);
              uVar11 = *(undefined8 *)(pcVar31 + 0x10);
              uVar12 = *(undefined8 *)(pcVar31 + 0x18);
              uVar13 = *(undefined8 *)(pcVar31 + 0x20);
              uVar14 = *(undefined8 *)(pcVar31 + 0x28);
              uVar15 = *(undefined8 *)(pcVar31 + 0x30);
              uVar16 = *(undefined8 *)(pcVar31 + 0x38);
              pcVar31 = data + (long)iVar3 + 0x40;
              uVar17 = *(undefined8 *)(pcVar31 + 8);
              uVar18 = *(undefined8 *)(pcVar31 + 0x10);
              uVar19 = *(undefined8 *)(pcVar31 + 0x18);
              uVar20 = *(undefined8 *)(pcVar31 + 0x20);
              uVar21 = *(undefined8 *)(pcVar31 + 0x28);
              uVar22 = *(undefined8 *)(pcVar31 + 0x30);
              uVar23 = *(undefined8 *)(pcVar31 + 0x38);
              puVar1 = (undefined8 *)((long)pcVar26->m_cells + lVar30 + 0x40);
              *puVar1 = *(undefined8 *)pcVar31;
              puVar1[1] = uVar17;
              puVar1[2] = uVar18;
              puVar1[3] = uVar19;
              puVar1[4] = uVar20;
              puVar1[5] = uVar21;
              puVar1[6] = uVar22;
              puVar1[7] = uVar23;
              puVar1 = (undefined8 *)((long)pcVar26->m_cells + lVar30);
              *puVar1 = uVar9;
              puVar1[1] = uVar10;
              puVar1[2] = uVar11;
              puVar1[3] = uVar12;
              puVar1[4] = uVar13;
              puVar1[5] = uVar14;
              puVar1[6] = uVar15;
              puVar1[7] = uVar16;
              pcVar29 = (cbtAlignedObjectArray<double> *)(ulong)(iVar3 + 0x80U);
            }
            lVar30 = lVar30 + 0x80;
            lVar28 = lVar28 + -1;
          } while (lVar28 != 0);
        }
        uVar36 = (uint)pcVar29;
        uVar35 = uVar35 + 1;
        unaff_R15 = pcVar29;
      } while (uVar35 != unaff_R12);
    }
    if ((int)(uVar36 + 8) <= size) {
      unaff_R15 = *(cbtAlignedObjectArray<double> **)(data + (int)uVar36);
      uVar36 = uVar36 + 8;
    }
    local_50.m_ownsMemory = true;
    local_50.m_data = (cbtCell32 *)0x0;
    local_50.m_size = 0;
    local_50.m_capacity = 0;
    cbtAlignedObjectArray<cbtAlignedObjectArray<unsigned_int>_>::resize
              (&this->m_cell_map,(int)unaff_R15,(cbtAlignedObjectArray<unsigned_int> *)&local_50);
    cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<unsigned_int> *)&local_50);
    if (unaff_R15 != (cbtAlignedObjectArray<double> *)0x0) {
      lVar28 = 0;
      pcVar29 = unaff_R15;
      do {
        if ((int)(uVar36 + 8) <= size) {
          pcVar29 = *(cbtAlignedObjectArray<double> **)(data + (int)uVar36);
          uVar36 = uVar36 + 8;
        }
        pcVar7 = (this->m_cell_map).m_data;
        iVar3 = pcVar7[lVar28].m_size;
        iVar34 = (int)pcVar29;
        if ((iVar3 <= iVar34) && (iVar3 < iVar34)) {
          if (pcVar7[lVar28].m_capacity < iVar34) {
            if (iVar34 == 0) {
              puVar27 = (uint *)0x0;
            }
            else {
              puVar27 = (uint *)cbtAlignedAllocInternal((long)iVar34 << 2,0x10);
            }
            iVar4 = pcVar7[lVar28].m_size;
            if (0 < (long)iVar4) {
              puVar8 = pcVar7[lVar28].m_data;
              lVar30 = 0;
              do {
                puVar27[lVar30] = puVar8[lVar30];
                lVar30 = lVar30 + 1;
              } while (iVar4 != lVar30);
            }
            if (pcVar7[lVar28].m_data != (uint *)0x0) {
              if (pcVar7[lVar28].m_ownsMemory == true) {
                cbtAlignedFreeInternal(pcVar7[lVar28].m_data);
              }
              pcVar7[lVar28].m_data = (uint *)0x0;
            }
            pcVar7[lVar28].m_ownsMemory = true;
            pcVar7[lVar28].m_data = puVar27;
            pcVar7[lVar28].m_capacity = iVar34;
          }
          if (iVar3 < iVar34) {
            memset(pcVar7[lVar28].m_data + iVar3,0,(long)iVar34 * 4 + (long)iVar3 * -4);
          }
        }
        pcVar7[lVar28].m_size = iVar34;
        if (pcVar29 != (cbtAlignedObjectArray<double> *)0x0) {
          lVar30 = 0;
          do {
            if ((int)(uVar36 + 4) <= size) {
              pcVar7[lVar28].m_data[lVar30] = *(uint *)(data + (int)uVar36);
              uVar36 = uVar36 + 4;
            }
            lVar30 = lVar30 + 1;
          } while (pcVar29 != (cbtAlignedObjectArray<double> *)lVar30);
        }
        lVar28 = lVar28 + 1;
      } while ((cbtAlignedObjectArray<double> *)lVar28 != unaff_R15);
    }
    uVar37 = uVar36 == size;
    this->m_isValid = (bool)uVar37;
  }
  else {
    uVar37 = this->m_isValid;
  }
  return (bool)uVar37;
}

Assistant:

bool cbtMiniSDF::load(const char* data, int size)
{
	int fileSize = -1;

	cbtSdfDataStream ds(data, size);
	{
		double buf[6];
		ds.read(buf);
		m_domain.m_min[0] = buf[0];
		m_domain.m_min[1] = buf[1];
		m_domain.m_min[2] = buf[2];
		m_domain.m_min[3] = 0;
		m_domain.m_max[0] = buf[3];
		m_domain.m_max[1] = buf[4];
		m_domain.m_max[2] = buf[5];
		m_domain.m_max[3] = 0;
	}
	{
		unsigned int buf2[3];
		ds.read(buf2);
		m_resolution[0] = buf2[0];
		m_resolution[1] = buf2[1];
		m_resolution[2] = buf2[2];
	}
	{
		double buf[3];
		ds.read(buf);
		m_cell_size[0] = buf[0];
		m_cell_size[1] = buf[1];
		m_cell_size[2] = buf[2];
	}
	{
		double buf[3];
		ds.read(buf);
		m_inv_cell_size[0] = buf[0];
		m_inv_cell_size[1] = buf[1];
		m_inv_cell_size[2] = buf[2];
	}
	{
		unsigned long long int cells;
		ds.read(cells);
		m_n_cells = cells;
	}
	{
		unsigned long long int fields;
		ds.read(fields);
		m_n_fields = fields;
	}

	unsigned long long int nodes0;
	std::size_t n_nodes0;
	ds.read(nodes0);
	n_nodes0 = nodes0;
	if (n_nodes0 > 1024 * 1024 * 1024)
	{
		return m_isValid;
	}
	m_nodes.resize(n_nodes0);
	for (unsigned int i = 0; i < n_nodes0; i++)
	{
		unsigned long long int n_nodes1;
		ds.read(n_nodes1);
		cbtAlignedObjectArray<double>& nodes = m_nodes[i];
		nodes.resize(n_nodes1);
		for (int j = 0; j < nodes.size(); j++)
		{
			double& node = nodes[j];
			ds.read(node);
		}
	}

	unsigned long long int n_cells0;
	ds.read(n_cells0);
	m_cells.resize(n_cells0);
	for (int i = 0; i < n_cells0; i++)
	{
		unsigned long long int n_cells1;
		cbtAlignedObjectArray<cbtCell32>& cells = m_cells[i];
		ds.read(n_cells1);
		cells.resize(n_cells1);
		for (int j = 0; j < n_cells1; j++)
		{
			cbtCell32& cell = cells[j];
			ds.read(cell);
		}
	}

	{
		unsigned long long int n_cell_maps0;
		ds.read(n_cell_maps0);

		m_cell_map.resize(n_cell_maps0);
		for (int i = 0; i < n_cell_maps0; i++)
		{
			unsigned long long int n_cell_maps1;
			cbtAlignedObjectArray<unsigned int>& cell_maps = m_cell_map[i];
			ds.read(n_cell_maps1);
			cell_maps.resize(n_cell_maps1);
			for (int j = 0; j < n_cell_maps1; j++)
			{
				unsigned int& cell_map = cell_maps[j];
				ds.read(cell_map);
			}
		}
	}

	m_isValid = (ds.m_currentOffset == ds.m_size);
	return m_isValid;
}